

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f * Matrix4f::rotateY(Matrix4f *__return_storage_ptr__,float radians)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  dVar2 = cos((double)radians);
  auVar4._0_8_ = sin((double)radians);
  auVar4._8_56_ = extraout_var;
  auVar3._0_4_ = (float)auVar4._0_8_;
  auVar3._4_12_ = auVar4._4_12_;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar1 = vxorps_avx512vl(auVar3,auVar1);
  __return_storage_ptr__->m_elements[0] = (float)dVar2;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = auVar1._0_4_;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 1.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = auVar3._0_4_;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = (float)dVar2;
  *(undefined1 (*) [16])(__return_storage_ptr__->m_elements + 0xb) = ZEXT816(0) << 0x20;
  __return_storage_ptr__->m_elements[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotateY( float radians )
{
	float c = cos( radians );
	float s = sin( radians );

	return Matrix4f
	(
		c, 0, s, 0,
		0, 1, 0, 0,
		-s, 0, c, 0,
		0, 0, 0, 1
	);
}